

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O3

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryAllocateInfo *allocInfo,VkDeviceSize alignment)

{
  Handle<(vk::HandleType)7> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  HostPtr *this_00;
  Allocation *pAVar5;
  void *pvVar6;
  VkDeviceSize in_R9;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  VkMemoryMapFlags flags;
  Move<vk::Handle<(vk::HandleType)7>_> local_68;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_40;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_30;
  
  this_00 = (HostPtr *)0x0;
  allocateMemory(&local_68,this->m_vk,this->m_device,allocInfo,(VkAllocationCallbacks *)0x0);
  flags = 0;
  if (((this->m_memProps).memoryTypes[allocInfo->memoryTypeIndex].propertyFlags & 2) != 0) {
    this_00 = (HostPtr *)operator_new(0x20);
    anon_unknown_6::HostPtr::HostPtr
              (this_00,this->m_vk,this->m_device,
               (VkDeviceMemory)
               local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
               allocInfo->allocationSize,in_R9,flags);
    local_40.m_data.ptr = (HostPtr *)0x0;
    de::details::
    UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::reset((UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             *)&stack0xffffffffffffff68);
    de::details::
    UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::reset(&local_40);
  }
  pAVar5 = (Allocation *)operator_new(0x50);
  pVVar4 = local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  pVVar3 = local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  pDVar2 = local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
  ;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (this_00 == (HostPtr *)0x0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = this_00->m_ptr;
  }
  (pAVar5->m_memory).m_internal = HVar1.m_internal;
  pAVar5->m_offset = 0;
  pAVar5->m_hostPtr = pvVar6;
  pAVar5->_vptr_Allocation = (_func_int **)&PTR__SimpleAllocation_00d50298;
  pAVar5[1]._vptr_Allocation = (_func_int **)HVar1.m_internal;
  pAVar5[1].m_hostPtr = pVVar4;
  pAVar5[1].m_memory.m_internal = (deUint64)pDVar2;
  pAVar5[1].m_offset = (VkDeviceSize)pVVar3;
  local_30.m_data.ptr = (HostPtr *)0x0;
  pAVar5[2]._vptr_Allocation = (_func_int **)this_00;
  (__return_storage_ptr__->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
  m_data.ptr = pAVar5;
  de::details::
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::reset(&local_30);
  de::details::
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::reset((UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
           *)&stack0xffffffffffffff68);
  if (local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_68.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryAllocateInfo& allocInfo, VkDeviceSize alignment)
{
	DE_UNREF(alignment);

	Move<VkDeviceMemory>	mem		= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>		hostPtr;

	if (isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex))
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}